

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::swizzleI8x16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  ulong uVar1;
  Literal *val;
  long lVar2;
  Literal *this_01;
  undefined1 local_4c0 [8];
  LaneArray<16> lanes;
  LaneArray<16> indices;
  LaneArray<16> result;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_4c0,(wasm *)this,other);
  getLanes<unsigned_char,16>((LaneArray<16> *)&lanes._M_elems[0xf].type,(wasm *)other,val);
  lVar2 = 0;
  memset(&indices._M_elems[0xf].type,0,0x180);
  this_00 = &result._M_elems[0xf].type;
  do {
    if (*(long *)((long)&indices._M_elems[0].field_0 + lVar2 + 8) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    uVar1 = (ulong)*(uint *)((long)indices._M_elems + lVar2 + -8);
    if (uVar1 < 0x10) {
      Literal((Literal *)this_00,(Literal *)&lanes._M_elems[uVar1 - 1].type);
    }
    else {
      result._M_elems[0xf].type.id._0_4_ = 0;
    }
    this_01 = (Literal *)((long)result._M_elems + lVar2 + -8);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x180);
  Literal(__return_storage_ptr__,(LaneArray<16> *)&indices._M_elems[0xf].type);
  lVar2 = 0x168;
  do {
    ~Literal((Literal *)((long)result._M_elems + lVar2 + -8));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x168;
  do {
    ~Literal((Literal *)((long)indices._M_elems + lVar2 + -8));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x168;
  do {
    ~Literal((Literal *)(local_4c0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::swizzleI8x16(const Literal& other) const {
  auto lanes = getLanesUI8x16();
  auto indices = other.getLanesUI8x16();
  LaneArray<16> result;
  for (size_t i = 0; i < 16; ++i) {
    size_t index = indices[i].geti32();
    result[i] = index >= 16 ? Literal(int32_t(0)) : lanes[index];
  }
  return Literal(result);
}